

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

BVSparse<Memory::JitArenaAllocator> * __thiscall
BackwardPass::GetByteCodeRegisterUpwardExposed
          (BackwardPass *this,BasicBlock *block,Func *func,JitArenaAllocator *alloc)

{
  Type TVar1;
  long lVar2;
  RegSlot i;
  Sym *this_00;
  StackSym *this_01;
  Func *pFVar3;
  BVSparse<Memory::JitArenaAllocator> *pBVar4;
  BVUnitT<unsigned_long> local_40;
  SparseBVUnit _unit;
  
  _unit.word = (Type)new<Memory::JitArenaAllocator>(0x20,alloc,0x3d6ef4);
  *(undefined8 *)_unit.word = 0;
  *(undefined8 *)(_unit.word + 8) = 0;
  *(JitArenaAllocator **)(_unit.word + 0x10) = alloc;
  *(Type *)(_unit.word + 0x18) = _unit.word;
  pBVar4 = block->byteCodeUpwardExposedUsed;
  while (pBVar4 = (BVSparse<Memory::JitArenaAllocator> *)pBVar4->head,
        pBVar4 != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    TVar1 = *(Type *)&pBVar4->lastFoundIndex;
    local_40.word = ((Type *)&pBVar4->alloc)->word;
    while (local_40.word != 0) {
      lVar2 = 0;
      if (local_40.word != 0) {
        for (; (local_40.word >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
        }
      }
      BVUnitT<unsigned_long>::Clear(&local_40,(BVIndex)lVar2);
      this_00 = SymTable::Find(func->m_symTable,TVar1 + (BVIndex)lVar2);
      if ((this_00 != (Sym *)0x0) && (this_00->m_kind == SymKindStack)) {
        this_01 = Sym::AsStackSym(this_00);
        pFVar3 = StackSym::GetByteCodeFunc(this_01);
        if ((pFVar3 == func) && ((this_01->field_0x19 & 0x20) != 0)) {
          i = StackSym::GetByteCodeRegSlot(this_01);
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((BVSparse<Memory::JitArenaAllocator> *)_unit.word,i);
        }
      }
    }
  }
  return (BVSparse<Memory::JitArenaAllocator> *)_unit.word;
}

Assistant:

BVSparse<JitArenaAllocator>*
BackwardPass::GetByteCodeRegisterUpwardExposed(BasicBlock* block, Func* func, JitArenaAllocator* alloc)
{
    BVSparse<JitArenaAllocator>* byteCodeRegisterUpwardExposed = JitAnew(alloc, BVSparse<JitArenaAllocator>, alloc);
    // Convert the sym to the corresponding bytecode register
    FOREACH_BITSET_IN_SPARSEBV(symID, block->byteCodeUpwardExposedUsed)
    {
        Sym* sym = func->m_symTable->Find(symID);
        if (sym && sym->IsStackSym())
        {
            StackSym* stackSym = sym->AsStackSym();
            // Make sure we only look at bytecode from the func we're interested in
            if (stackSym->GetByteCodeFunc() == func && stackSym->HasByteCodeRegSlot())
            {
                Js::RegSlot bytecode = stackSym->GetByteCodeRegSlot();
                byteCodeRegisterUpwardExposed->Set(bytecode);
            }
        }
    }
    NEXT_BITSET_IN_SPARSEBV;

    return byteCodeRegisterUpwardExposed;
}